

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::validate_header
          (HL1MDLLoader *this,Header_HL1 *header,bool is_texture_header)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  Logger *pLVar4;
  long *plVar5;
  undefined8 *puVar6;
  runtime_error *prVar7;
  uint uVar8;
  ulong *puVar9;
  long *plVar10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  _Alloc_hider _Var13;
  uint uVar14;
  uint uVar15;
  string __str;
  string __str_1;
  string local_1b0;
  ulong *local_190;
  long local_188;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((int)CONCAT71(in_register_00000011,is_texture_header) != 0) {
    iVar1 = header->numtextures;
    if (iVar1 == 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"[Half-Life 1 MDL] There are no textures in the file","");
      std::runtime_error::runtime_error(prVar7,(string *)&local_1b0);
      *(undefined ***)prVar7 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (100 < iVar1) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"textures","");
      log_warning_limit_exceeded<100>(iVar1,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
    }
    iVar1 = header->numskinfamilies;
    if (iVar1 < 0x65) {
      return;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"skin families","");
    log_warning_limit_exceeded<100>(iVar1,&local_1b0);
    local_a0._M_allocated_capacity = local_1b0.field_2._M_allocated_capacity;
    _Var13._M_p = local_1b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) {
      return;
    }
    goto LAB_0048c656;
  }
  iVar1 = header->numbodyparts;
  if (iVar1 == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"[Half-Life 1 MDL] Model has no bodyparts","");
    std::runtime_error::runtime_error(prVar7,(string *)&local_1b0);
    *(undefined ***)prVar7 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (header->numbones == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"[Half-Life 1 MDL] Model has no bones","");
    std::runtime_error::runtime_error(prVar7,(string *)&local_1b0);
    *(undefined ***)prVar7 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (header->numseqgroups == 0) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"[Half-Life 1 MDL] Model has no sequence groups","");
    std::runtime_error::runtime_error(prVar7,(string *)&local_1b0);
    *(undefined ***)prVar7 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x20 < iVar1) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"bodyparts","");
    log_warning_limit_exceeded<32>(iVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = header->numbones;
  if (0x80 < (int)uVar2) {
    local_b0[0] = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"bones","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70.field_2._M_allocated_capacity._0_4_ = 0x65646f4d;
    local_70.field_2._M_allocated_capacity._4_2_ = 0x6c;
    local_70._M_string_length = 5;
    pLVar4 = DefaultLogger::get();
    std::operator+(&local_50,"[Half-Life 1 MDL] ",&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_160 = *puVar9;
      lStack_158 = plVar5[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *puVar9;
      local_170 = (ulong *)*plVar5;
    }
    local_168 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar15 = uVar2;
    uVar8 = 4;
    do {
      uVar14 = uVar8;
      if (uVar15 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0048b4e4;
      }
      if (uVar15 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0048b4e4;
      }
      if (uVar15 < 10000) goto LAB_0048b4e4;
      bVar3 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      uVar8 = uVar14 + 4;
    } while (bVar3);
    uVar14 = uVar14 + 1;
LAB_0048b4e4:
    local_190 = local_180;
    std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_190,uVar14,uVar2);
    uVar12 = 0xf;
    if (local_170 != &local_160) {
      uVar12 = local_160;
    }
    if (uVar12 < (ulong)(local_188 + local_168)) {
      uVar12 = 0xf;
      if (local_190 != local_180) {
        uVar12 = local_180[0];
      }
      if (uVar12 < (ulong)(local_188 + local_168)) goto LAB_0048b54b;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_170);
    }
    else {
LAB_0048b54b:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
    }
    local_150 = &local_140;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_140 = *plVar5;
      uStack_138 = puVar6[3];
    }
    else {
      local_140 = *plVar5;
      local_150 = (long *)*puVar6;
    }
    local_148 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_d0 = &local_c0;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_c0 = *plVar10;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0 = *plVar10;
      local_d0 = (long *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0[0]);
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar10;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e0 = *puVar9;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar9;
      local_f0 = (ulong *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_110 = local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110,3,0x80);
    uVar12 = 0xf;
    if (local_f0 != &local_e0) {
      uVar12 = local_e0;
    }
    if (uVar12 < (ulong)(local_108 + local_e8)) {
      uVar12 = 0xf;
      if (local_110 != local_100) {
        uVar12 = local_100[0];
      }
      if (uVar12 < (ulong)(local_108 + local_e8)) goto LAB_0048b770;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_0048b770:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
    }
    local_130 = &local_120;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_120 = *plVar5;
      uStack_118 = puVar6[3];
    }
    else {
      local_120 = *plVar5;
      local_130 = (long *)*puVar6;
    }
    local_128 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar11 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0.field_2._8_8_ = plVar5[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Logger::warn(pLVar4,local_1b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                        local_70.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (local_b0[0] != &local_a0) {
      operator_delete(local_b0[0],local_a0._M_allocated_capacity + 1);
    }
  }
  uVar2 = header->numbonecontrollers;
  if (8 < (int)uVar2) {
    local_b0[0] = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"bone controllers","");
    local_70.field_2._M_allocated_capacity._0_4_ = 0x65646f4d;
    local_70.field_2._M_allocated_capacity._4_2_ = 0x6c;
    local_70._M_string_length = 5;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pLVar4 = DefaultLogger::get();
    std::operator+(&local_50,"[Half-Life 1 MDL] ",&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_160 = *puVar9;
      lStack_158 = plVar5[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *puVar9;
      local_170 = (ulong *)*plVar5;
    }
    local_168 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar15 = 1;
    if (uVar2 != 9) {
      uVar8 = uVar2;
      uVar14 = 4;
      do {
        uVar15 = uVar14;
        if (uVar8 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_0048baf5;
        }
        if (uVar8 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_0048baf5;
        }
        if (uVar8 < 10000) goto LAB_0048baf5;
        bVar3 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar14 = uVar15 + 4;
      } while (bVar3);
      uVar15 = uVar15 + 1;
    }
LAB_0048baf5:
    local_190 = local_180;
    std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar15);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_190,uVar15,uVar2);
    uVar12 = 0xf;
    if (local_170 != &local_160) {
      uVar12 = local_160;
    }
    if (uVar12 < (ulong)(local_188 + local_168)) {
      uVar12 = 0xf;
      if (local_190 != local_180) {
        uVar12 = local_180[0];
      }
      if (uVar12 < (ulong)(local_188 + local_168)) goto LAB_0048bb61;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_170);
    }
    else {
LAB_0048bb61:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
    }
    local_150 = &local_140;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_140 = *plVar5;
      uStack_138 = puVar6[3];
    }
    else {
      local_140 = *plVar5;
      local_150 = (long *)*puVar6;
    }
    local_148 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_d0 = &local_c0;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_c0 = *plVar10;
      lStack_b8 = plVar5[3];
    }
    else {
      local_c0 = *plVar10;
      local_d0 = (long *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0[0]);
    local_90 = &local_80;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar5[3];
    }
    else {
      local_80 = *plVar10;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_e0 = *puVar9;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar9;
      local_f0 = (ulong *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_110 = local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x01');
    *(undefined1 *)local_110 = 0x38;
    uVar12 = 0xf;
    if (local_f0 != &local_e0) {
      uVar12 = local_e0;
    }
    if (uVar12 < (ulong)(local_108 + local_e8)) {
      uVar12 = 0xf;
      if (local_110 != local_100) {
        uVar12 = local_100[0];
      }
      if (uVar12 < (ulong)(local_108 + local_e8)) goto LAB_0048bd77;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_0048bd77:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
    }
    local_130 = &local_120;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_120 = *plVar5;
      uStack_118 = puVar6[3];
    }
    else {
      local_120 = *plVar5;
      local_130 = (long *)*puVar6;
    }
    local_128 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar11 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0.field_2._8_8_ = plVar5[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar11;
      local_1b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Logger::warn(pLVar4,local_1b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                        local_70.field_2._M_allocated_capacity._0_4_)) + 1);
    }
    if (local_b0[0] != &local_a0) {
      operator_delete(local_b0[0],local_a0._M_allocated_capacity + 1);
    }
  }
  iVar1 = header->numseq;
  if (0x800 < iVar1) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"sequences","");
    log_warning_limit_exceeded<2048>(iVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = header->numseqgroups;
  if (0x20 < iVar1) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"sequence groups","");
    log_warning_limit_exceeded<32>(iVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = header->numattachments;
  if ((int)uVar2 < 0x201) {
    return;
  }
  local_b0[0] = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"attachments","");
  local_70.field_2._M_allocated_capacity._0_4_ = 0x65646f4d;
  local_70.field_2._M_allocated_capacity._4_2_ = 0x6c;
  local_70._M_string_length = 5;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pLVar4 = DefaultLogger::get();
  std::operator+(&local_50,"[Half-Life 1 MDL] ",&local_70);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_160 = *puVar9;
    lStack_158 = plVar5[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar9;
    local_170 = (ulong *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar15 = uVar2;
  uVar8 = 4;
  do {
    uVar14 = uVar8;
    if (uVar15 < 100) {
      uVar14 = uVar14 - 2;
      goto LAB_0048c18a;
    }
    if (uVar15 < 1000) {
      uVar14 = uVar14 - 1;
      goto LAB_0048c18a;
    }
    if (uVar15 < 10000) goto LAB_0048c18a;
    bVar3 = 99999 < uVar15;
    uVar15 = uVar15 / 10000;
    uVar8 = uVar14 + 4;
  } while (bVar3);
  uVar14 = uVar14 + 1;
LAB_0048c18a:
  local_190 = local_180;
  std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar14);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_190,uVar14,uVar2);
  uVar12 = 0xf;
  if (local_170 != &local_160) {
    uVar12 = local_160;
  }
  if (uVar12 < (ulong)(local_188 + local_168)) {
    uVar12 = 0xf;
    if (local_190 != local_180) {
      uVar12 = local_180[0];
    }
    if (uVar12 < (ulong)(local_188 + local_168)) goto LAB_0048c1f1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_0048c1f1:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
  }
  local_150 = &local_140;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_140 = *plVar5;
    uStack_138 = puVar6[3];
  }
  else {
    local_140 = *plVar5;
    local_150 = (long *)*puVar6;
  }
  local_148 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_d0 = &local_c0;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_c0 = *plVar10;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0 = *plVar10;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0[0]);
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_e0 = *puVar9;
    lStack_d8 = plVar5[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar9;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110,3,0x200);
  uVar12 = 0xf;
  if (local_f0 != &local_e0) {
    uVar12 = local_e0;
  }
  if (uVar12 < (ulong)(local_108 + local_e8)) {
    uVar12 = 0xf;
    if (local_110 != local_100) {
      uVar12 = local_100[0];
    }
    if (uVar12 < (ulong)(local_108 + local_e8)) goto LAB_0048c414;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0048c414:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
  }
  local_130 = &local_120;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_120 = *plVar5;
    uStack_118 = puVar6[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*puVar6;
  }
  local_128 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar11 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1b0.field_2._M_allocated_capacity = *psVar11;
    local_1b0.field_2._8_8_ = plVar5[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar11;
    local_1b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Logger::warn(pLVar4,local_1b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT26(local_70.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_70.field_2._M_allocated_capacity._4_2_,
                                      local_70.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  _Var13._M_p = (pointer)local_b0[0];
  if (local_b0[0] == &local_a0) {
    return;
  }
LAB_0048c656:
  operator_delete(_Var13._M_p,local_a0._M_allocated_capacity + 1);
  return;
}

Assistant:

void HL1MDLLoader::validate_header(const Header_HL1 *header, bool is_texture_header) {
    if (is_texture_header) {
        // Every single Half-Life model is assumed to have at least one texture.
        if (!header->numtextures)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "There are no textures in the file");

        if (header->numtextures > AI_MDL_HL1_MAX_TEXTURES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_TEXTURES>(header->numtextures, "textures");

        if (header->numskinfamilies > AI_MDL_HL1_MAX_SKIN_FAMILIES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SKIN_FAMILIES>(header->numskinfamilies, "skin families");

    } else {
        // Every single Half-Life model is assumed to have at least one bodypart.
        if (!header->numbodyparts)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bodyparts");

        // Every single Half-Life model is assumed to have at least one bone.
        if (!header->numbones)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bones");

        // Every single Half-Life model is assumed to have at least one sequence group,
        // which is the "default" sequence group.
        if (!header->numseqgroups)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no sequence groups");

        if (header->numbodyparts > AI_MDL_HL1_MAX_BODYPARTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BODYPARTS>(header->numbodyparts, "bodyparts");

        if (header->numbones > AI_MDL_HL1_MAX_BONES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONES>(header->numbones, "bones");

        if (header->numbonecontrollers > AI_MDL_HL1_MAX_BONE_CONTROLLERS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONE_CONTROLLERS>(header->numbonecontrollers, "bone controllers");

        if (header->numseq > AI_MDL_HL1_MAX_SEQUENCES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCES>(header->numseq, "sequences");

        if (header->numseqgroups > AI_MDL_HL1_MAX_SEQUENCE_GROUPS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCE_GROUPS>(header->numseqgroups, "sequence groups");

        if (header->numattachments > AI_MDL_HL1_MAX_ATTACHMENTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_ATTACHMENTS>(header->numattachments, "attachments");
    }
}